

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqastparser.cpp
# Opt level: O0

Expr * __thiscall
SQCompilation::SQParser::Expression(SQParser *this,SQExpressionContext expression_context)

{
  SQExpressionContext SVar1;
  long lVar2;
  SQExpressionContext in_ESI;
  SQParser *in_RDI;
  Expr *ifFalse;
  Expr *ifTrue;
  Expr *e2;
  SQInteger op;
  Expr *expr;
  SQExpressionContext saved_expression_context;
  NestingChecker nc;
  SQParser *in_stack_ffffffffffffff18;
  SQParser *in_stack_ffffffffffffff20;
  SQParser *in_stack_ffffffffffffff30;
  Expr *in_stack_ffffffffffffff38;
  Expr *in_stack_ffffffffffffff40;
  Expr *in_stack_ffffffffffffff48;
  TreeOp args;
  SQParser *in_stack_ffffffffffffff50;
  SQInteger in_stack_ffffffffffffff68;
  SQParser *in_stack_ffffffffffffff70;
  TerExpr *local_30;
  SQExpressionContext in_stack_ffffffffffffffec;
  undefined4 in_stack_fffffffffffffff0;
  
  NestingChecker::NestingChecker
            ((NestingChecker *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  SVar1 = in_RDI->_expression_context;
  in_RDI->_expression_context = in_ESI;
  local_30 = (TerExpr *)LogicalNullCoalesceExp(in_stack_ffffffffffffff70);
  lVar2 = in_RDI->_token;
  if (lVar2 != 0x3d) {
    if (lVar2 == 0x3f) {
      Consume(in_stack_ffffffffffffff20,(SQInteger)in_stack_ffffffffffffff18);
      Expression((SQParser *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_stack_ffffffffffffffec);
      Expect(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
      Expression((SQParser *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_stack_ffffffffffffffec);
      local_30 = newNode<SQCompilation::TerExpr,SQCompilation::Expr*,SQCompilation::Expr*,SQCompilation::Expr*>
                           (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
                            in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
      goto LAB_001b8010;
    }
    if (((lVar2 != 0x119) && (1 < lVar2 - 0x121U)) && (2 < lVar2 - 0x13dU)) goto LAB_001b8010;
  }
  lVar2 = in_RDI->_token;
  Lex(in_stack_ffffffffffffff30);
  args = (TreeOp)((ulong)in_stack_ffffffffffffff48 >> 0x20);
  Expression((SQParser *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_stack_ffffffffffffffec);
  if (lVar2 == 0x3d) {
    switch(in_ESI) {
    case SQE_REGULAR:
      break;
    case SQE_IF:
      reportDiagnostic(in_RDI,0x1e,"if");
      break;
    case SQE_SWITCH:
      reportDiagnostic(in_RDI,0x1e,"switch");
      break;
    case SQE_LOOP_CONDITION:
      reportDiagnostic(in_RDI,0x1e,"loop condition");
      break;
    case SQE_FUNCTION_ARG:
      reportDiagnostic(in_RDI,0x1e,"function argument");
      break;
    case SQE_RVALUE:
      reportDiagnostic(in_RDI,0x1e,"expression");
      break;
    case SQE_ARRAY_ELEM:
      reportDiagnostic(in_RDI,0x1e,"array element");
    }
    local_30 = (TerExpr *)
               newNode<SQCompilation::BinExpr,TreeOp,SQCompilation::Expr*,SQCompilation::Expr*>
                         (in_stack_ffffffffffffff50,args,in_stack_ffffffffffffff40,
                          in_stack_ffffffffffffff38);
  }
  else if (lVar2 == 0x119) {
    local_30 = (TerExpr *)
               newNode<SQCompilation::BinExpr,TreeOp,SQCompilation::Expr*,SQCompilation::Expr*>
                         (in_stack_ffffffffffffff50,args,in_stack_ffffffffffffff40,
                          in_stack_ffffffffffffff38);
  }
  else if (lVar2 == 0x121) {
    local_30 = (TerExpr *)
               newNode<SQCompilation::BinExpr,TreeOp,SQCompilation::Expr*,SQCompilation::Expr*>
                         (in_stack_ffffffffffffff50,args,in_stack_ffffffffffffff40,
                          in_stack_ffffffffffffff38);
  }
  else if (lVar2 == 0x122) {
    local_30 = (TerExpr *)
               newNode<SQCompilation::BinExpr,TreeOp,SQCompilation::Expr*,SQCompilation::Expr*>
                         (in_stack_ffffffffffffff50,args,in_stack_ffffffffffffff40,
                          in_stack_ffffffffffffff38);
  }
  else if (lVar2 == 0x13d) {
    local_30 = (TerExpr *)
               newNode<SQCompilation::BinExpr,TreeOp,SQCompilation::Expr*,SQCompilation::Expr*>
                         (in_stack_ffffffffffffff50,args,in_stack_ffffffffffffff40,
                          in_stack_ffffffffffffff38);
  }
  else if (lVar2 == 0x13e) {
    local_30 = (TerExpr *)
               newNode<SQCompilation::BinExpr,TreeOp,SQCompilation::Expr*,SQCompilation::Expr*>
                         (in_stack_ffffffffffffff50,args,in_stack_ffffffffffffff40,
                          in_stack_ffffffffffffff38);
  }
  else if (lVar2 == 0x13f) {
    local_30 = (TerExpr *)
               newNode<SQCompilation::BinExpr,TreeOp,SQCompilation::Expr*,SQCompilation::Expr*>
                         (in_stack_ffffffffffffff50,args,in_stack_ffffffffffffff40,
                          in_stack_ffffffffffffff38);
  }
LAB_001b8010:
  in_RDI->_expression_context = SVar1;
  NestingChecker::~NestingChecker((NestingChecker *)&stack0xffffffffffffffe0);
  return &local_30->super_Expr;
}

Assistant:

Expr* SQParser::Expression(SQExpressionContext expression_context)
{
    NestingChecker nc(this);
    SQExpressionContext saved_expression_context = _expression_context;
    _expression_context = expression_context;

    Expr *expr = LogicalNullCoalesceExp();

    switch(_token)  {
    case _SC('='):
    case TK_NEWSLOT:
    case TK_MINUSEQ:
    case TK_PLUSEQ:
    case TK_MULEQ:
    case TK_DIVEQ:
    case TK_MODEQ: {
        SQInteger op = _token;
        Lex();
        Expr *e2 = Expression(SQE_RVALUE);

        switch (op) {
        case TK_NEWSLOT:
            expr = newNode<BinExpr>(TO_NEWSLOT, expr, e2);
            break;
        case _SC('='): //ASSIGN
            switch (expression_context)
            {
            case SQE_IF:
                reportDiagnostic(DiagnosticsId::DI_ASSIGN_INSIDE_FORBIDDEN, "if");
                break;
            case SQE_LOOP_CONDITION:
                reportDiagnostic(DiagnosticsId::DI_ASSIGN_INSIDE_FORBIDDEN, "loop condition");
                break;
            case SQE_SWITCH:
                reportDiagnostic(DiagnosticsId::DI_ASSIGN_INSIDE_FORBIDDEN, "switch");
                break;
            case SQE_FUNCTION_ARG:
                reportDiagnostic(DiagnosticsId::DI_ASSIGN_INSIDE_FORBIDDEN, "function argument");
                break;
            case SQE_RVALUE:
                reportDiagnostic(DiagnosticsId::DI_ASSIGN_INSIDE_FORBIDDEN, "expression");
                break;
            case SQE_ARRAY_ELEM:
                reportDiagnostic(DiagnosticsId::DI_ASSIGN_INSIDE_FORBIDDEN, "array element");
                break;
            case SQE_REGULAR:
                break;
            }
            expr = newNode<BinExpr>(TO_ASSIGN, expr, e2);
            break;
        case TK_MINUSEQ: expr = newNode<BinExpr>(TO_MINUSEQ, expr, e2); break;
        case TK_PLUSEQ: expr = newNode<BinExpr>(TO_PLUSEQ, expr, e2); break;
        case TK_MULEQ: expr = newNode<BinExpr>(TO_MULEQ, expr, e2); break;
        case TK_DIVEQ: expr = newNode<BinExpr>(TO_DIVEQ, expr, e2); break;
        case TK_MODEQ: expr = newNode<BinExpr>(TO_MODEQ, expr, e2); break;
        }
    }
    break;
    case _SC('?'): {
        Consume('?');

        Expr *ifTrue = Expression(SQE_RVALUE);

        Expect(_SC(':'));

        Expr *ifFalse = Expression(SQE_RVALUE);

        expr = newNode<TerExpr>(expr, ifTrue, ifFalse);
    }
    break;
    }

    _expression_context = saved_expression_context;
    return expr;
}